

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJIO.cpp
# Opt level: O3

int main(void)

{
  Am_Slot_Key AVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Am_Object *pAVar6;
  Am_Value *pAVar7;
  Am_Wrapper *pAVar8;
  Am_Object AVar9;
  Am_Object how_set_inter;
  Am_Object title;
  Am_Object qbutton;
  Am_Object instructions2;
  Am_Object instructions1;
  Am_Object cmd;
  Am_Object instructions3;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Font local_58 [8];
  Am_Font local_50 [8];
  Am_Font local_48 [8];
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  
  Am_Initialize();
  Am_Object::Create((char *)&local_98);
  uVar2 = Am_Object::Set((ushort)&local_98,100,0x14);
  uVar2 = Am_Object::Set(uVar2,0x65,0x14);
  uVar2 = Am_Object::Set(uVar2,0x66,0x2ee);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,0x67,500);
  Am_Object::operator=(&mywin,pAVar6);
  Am_Object::~Am_Object(&local_98);
  Am_Object::Am_Object(&local_18,&mywin);
  Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_18,0),1);
  Am_Object::~Am_Object(&local_18);
  Am_Object::Create((char *)&local_80);
  uVar2 = Am_Object::Set((ushort)&local_80,100,10);
  uVar2 = Am_Object::Set(uVar2,0x65,10);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(char *)0xab,0x1095ba);
  Am_Object::Am_Object(&local_98,pAVar6);
  Am_Object::~Am_Object(&local_80);
  Am_Object::Am_Object(&local_20,&local_98);
  Am_Object::Add_Part((Am_Object)0x10c358,SUB81(&local_20,0),1);
  Am_Object::~Am_Object(&local_20);
  Am_Object::Create((char *)&local_88);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_98,0x65);
  uVar3 = Am_Value::operator_cast_to_int(pAVar7);
  uVar2 = Am_Object::Set((ushort)&local_88,0x65,(ulong)uVar3);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_98,100);
  iVar4 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_98,0x66);
  iVar5 = Am_Value::operator_cast_to_int(pAVar7);
  uVar2 = Am_Object::Set(uVar2,100,(ulong)(iVar4 + iVar5 + 10));
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(char *)0xab,0x1095e3);
  Am_Object::Am_Object(&local_80,pAVar6);
  Am_Object::~Am_Object(&local_88);
  Am_Object::Am_Object(&local_28,&local_80);
  Am_Object::Add_Part((Am_Object)0x10c358,SUB81(&local_28,0),1);
  Am_Object::~Am_Object(&local_28);
  Am_Object::Create((char *)&local_70);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_98,0x65);
  iVar4 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_98,0x67);
  iVar5 = Am_Value::operator_cast_to_int(pAVar7);
  uVar2 = Am_Object::Set((ushort)&local_70,0x65,(ulong)(iVar4 + iVar5 + 2));
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_80,100);
  uVar3 = Am_Value::operator_cast_to_int(pAVar7);
  uVar2 = Am_Object::Set(uVar2,100,(ulong)uVar3);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(char *)0xab,0x10962f);
  Am_Object::Am_Object(&local_88,pAVar6);
  Am_Object::~Am_Object(&local_70);
  Am_Object::Am_Object(&local_30,&local_88);
  Am_Object::Add_Part((Am_Object)0x10c358,SUB81(&local_30,0),1);
  Am_Object::~Am_Object(&local_30);
  Am_Object::Create((char *)&local_90);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_88,0x65);
  iVar4 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_88,0x67);
  iVar5 = Am_Value::operator_cast_to_int(pAVar7);
  uVar2 = Am_Object::Set((ushort)&local_90,0x65,(ulong)(iVar4 + iVar5 + 2));
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_80,100);
  uVar3 = Am_Value::operator_cast_to_int(pAVar7);
  uVar2 = Am_Object::Set(uVar2,100,(ulong)uVar3);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(char *)0xab,0x109674);
  Am_Object::Am_Object(&local_70,pAVar6);
  Am_Object::~Am_Object(&local_90);
  Am_Object::Am_Object(&local_38,&local_70);
  Am_Object::Add_Part((Am_Object)0x10c358,SUB81(&local_38,0),1);
  Am_Object::~Am_Object(&local_38);
  Am_Object::Create((char *)&local_a0);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_98,0x65);
  uVar3 = Am_Value::operator_cast_to_int(pAVar7);
  uVar2 = Am_Object::Set((ushort)&local_a0,0x65,(ulong)uVar3);
  pAVar8 = Am_Font::operator_cast_to_Am_Wrapper_((Am_Font *)&JTM_Font);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0xac,(ulong)pAVar8);
  Am_Object::Am_Object(&local_90,pAVar6);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::Get_Object((ushort)&local_a0,(ulong)&local_90);
  uVar2 = Am_Object::Set((ushort)&local_a0,(char *)0x150,0x1096b1);
  Am_Object::Set(uVar2,(Am_Method_Wrapper *)0xca,(ulong)qmethod.from_wrapper);
  Am_Object::~Am_Object(&local_a0);
  pAVar7 = (Am_Value *)Am_Object::Get(0xc358,0x66);
  iVar4 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_90,0x66);
  iVar5 = Am_Value::operator_cast_to_int(pAVar7);
  Am_Object::Set((ushort)&local_90,100,(ulong)((iVar4 - iVar5) - 10));
  Am_Object::Am_Object(&local_40,&local_90);
  Am_Object::Add_Part((Am_Object)0x10c358,SUB81(&local_40,0),1);
  Am_Object::~Am_Object(&local_40);
  Test_Group_Init();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Initializing Size Face Group\n",0x1d);
  std::ostream::flush();
  Size_Face_Init((char *)&local_a0,"\x1b$B4A;z%U%)%s%H%F%9%H\x1b(B",
                 "\x1b$B$3$l$O4A;z%F%-%9%H$NNc$G$9!#\x1b(B");
  Am_Object::operator=(&Size_Face_Group,&local_a0);
  Am_Object::~Am_Object(&local_a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Initializing Size Face (EUC) Group\n",0x23);
  std::ostream::flush();
  Size_Face_Init((char *)&local_a0,anon_var_dwarf_25db,anon_var_dwarf_25f3);
  Am_Object::operator=(&Size_Face_EUC_Group,&local_a0);
  Am_Object::~Am_Object(&local_a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Initializing More Sizes Group\n",0x1e);
  std::ostream::flush();
  More_Sizes_Init();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Initializing Families Group\n",0x1c);
  std::ostream::flush();
  Families_Init();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Initializing Edit Group\n",0x18);
  std::ostream::flush();
  Edit_Init((char *)&local_a0,"\x1b$B4A;zF~NO%F%9%H\x1b(B");
  Am_Object::operator=(&Edit_Group,&local_a0);
  Am_Object::~Am_Object(&local_a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Initializing Edit Group (EUC) \n",0x1f);
  std::ostream::flush();
  Edit_Init((char *)&local_a0,anon_var_dwarf_2677);
  Am_Object::operator=(&Edit_EUC_Group,&local_a0);
  Am_Object::~Am_Object(&local_a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Initializing Ktable Group\n",0x1a);
  std::ostream::flush();
  Am_Font::Am_Font(local_48,(Am_Font *)&JTL_Font);
  Ktable_Init((Am_Font *)&local_a0,(char *)local_48,"\x1b$B4A;z%3!<%II=\x1b(B",
              "Japanese Kanji Code Table");
  Am_Object::operator=(&Ktable_Group,&local_a0);
  Am_Object::~Am_Object(&local_a0);
  Am_Font::~Am_Font(local_48);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Initializing Kktable Group\n",0x1b);
  std::ostream::flush();
  Am_Font::Am_Font(local_50,(Am_Font *)&KTL_Font);
  Ktable_Init((Am_Font *)&local_a0,(char *)local_50,"\x1b$B4A;z%3!<%II=\x1b(B","Korean Code Table");
  Am_Object::operator=(&Kktable_Group,&local_a0);
  Am_Object::~Am_Object(&local_a0);
  Am_Font::~Am_Font(local_50);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Initializing Kctable Group\n",0x1b);
  std::ostream::flush();
  Am_Font::Am_Font(local_58,(Am_Font *)&CTL_Font);
  Ktable_Init((Am_Font *)&local_a0,(char *)local_58,"\x1b$B4A;z%3!<%II=\x1b(B","Chinese Code Table")
  ;
  Am_Object::operator=(&Kctable_Group,&local_a0);
  Am_Object::~Am_Object(&local_a0);
  Am_Font::~Am_Font(local_58);
  Am_Object::Create((char *)&local_78);
  uVar2 = Am_Object::Set((ushort)&local_78,(char *)0xb9,0x1098f3);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,true,1);
  Am_Object::Am_Object(&local_a0,pAVar6);
  Am_Object::~Am_Object(&local_78);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_a0,0xc5);
  Am_Object::Am_Object(&local_78,pAVar7);
  Am_Object::Set((ushort)&local_78,(Am_Method_Wrapper *)0xca,(ulong)change_setting.from_wrapper);
  Am_Object::Am_Object(&local_60,&local_a0);
  Am_Object::Add_Part((Am_Object)0x10c358,SUB81(&local_60,0),1);
  Am_Object::~Am_Object(&local_60);
  AVar1 = DISPLAY_PART;
  Am_Object::Am_Object(&local_68,&Test_Group);
  AVar9.data._2_6_ = 0;
  AVar9.data._0_2_ = AVar1;
  Am_Object::Add_Part(0xc358,AVar9,(ulong)&local_68);
  Am_Object::~Am_Object(&local_68);
  Am_Main_Event_Loop();
  Am_Cleanup();
  Am_Object::~Am_Object(&local_78);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::~Am_Object(&local_90);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_88);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_98);
  return 0;
}

Assistant:

int
main()
{
  Am_Initialize();

  mywin = Am_Window.Create("mywin")
              .Set(Am_LEFT, 20)
              .Set(Am_TOP, 20)
              .Set(Am_WIDTH, 750)
              .Set(Am_HEIGHT, 500);
  Am_Screen.Add_Part(mywin);

  Am_Object title = Am_Text.Create("title")
                        .Set(Am_LEFT, 10)
                        .Set(Am_TOP, 10)
                        .Set(Am_TEXT, "Japanese I/O Test  Type:  ");
  mywin.Add_Part(title);

  Am_Object instructions1 =
      Am_Text.Create("instructions1")
          .Set(Am_TOP, (int)title.Get(Am_TOP))
          .Set(Am_LEFT, (int)title.Get(Am_LEFT) + (int)title.Get(Am_WIDTH) + 10)
          .Set(Am_TEXT,
               "1 for Size Face, 2 for More Sizes, 3 for Families, 4 for Edit");
  mywin.Add_Part(instructions1);

  Am_Object instructions2 =
      Am_Text.Create("instructions2")
          .Set(Am_TOP, (int)title.Get(Am_TOP) + (int)title.Get(Am_HEIGHT) + 2)
          .Set(Am_LEFT, (int)instructions1.Get(Am_LEFT))
          .Set(Am_TEXT, "5 for Size Face (EUC), 6 for Edit (EUC), 7 for "
                        "Ktable, 8 for Kktable");
  mywin.Add_Part(instructions2);

  Am_Object instructions3 =
      Am_Text.Create("instructions2")
          .Set(Am_TOP, (int)instructions2.Get(Am_TOP) +
                           (int)instructions2.Get(Am_HEIGHT) + 2)
          .Set(Am_LEFT, (int)instructions1.Get(Am_LEFT))
          .Set(Am_TEXT, "9 for Kctable, 0 for Nothing, q (or button) for Quit");
  mywin.Add_Part(instructions3);

  Am_Object qbutton = Am_Button.Create("qbutton")
                          .Set(Am_TOP, (int)title.Get(Am_TOP))
                          .Set(Am_FONT, QBUTTON_FONT);
  qbutton.Get_Object(Am_COMMAND)
      .Set(Am_LABEL, QBUTTON_STRING)
      .Set(Am_DO_METHOD, qmethod);
  qbutton.Set(Am_LEFT,
              (int)mywin.Get(Am_WIDTH) - (int)qbutton.Get(Am_WIDTH) - 10);
  mywin.Add_Part(qbutton);

  Test_Group_Init();
  cout << "Initializing Size Face Group\n" << flush;
  Size_Face_Group = Size_Face_Init(KANJI, TEST_STRING, "Size Face");
  cout << "Initializing Size Face (EUC) Group\n" << flush;
  Size_Face_EUC_Group =
      Size_Face_Init(EUC_KANJI, EUC_TEST_STRING, "Size Face EUC");
  cout << "Initializing More Sizes Group\n" << flush;
  More_Sizes_Init();
  cout << "Initializing Families Group\n" << flush;
  Families_Init();
  cout << "Initializing Edit Group\n" << flush;
  Edit_Group = Edit_Init(KANJIE, PTEXT_STRING);
  cout << "Initializing Edit Group (EUC) \n" << flush;
  Edit_EUC_Group = Edit_Init(EUC_KANJIE, EUC_PTEXT_STRING);
  cout << "Initializing Ktable Group\n" << flush;
  Ktable_Group =
      Ktable_Init(KLINE_FONT, KTITLE, "Japanese Kanji Code Table", "Ktable");
  cout << "Initializing Kktable Group\n" << flush;
  Kktable_Group =
      Ktable_Init(KKLINE_FONT, KKTITLE, "Korean Code Table", "Kktable");
  cout << "Initializing Kctable Group\n" << flush;
  Kctable_Group =
      Ktable_Init(KCLINE_FONT, KCTITLE, "Chinese Code Table", "Kctable");

  Am_Object how_set_inter = Am_One_Shot_Interactor.Create("change_settings")
                                .Set(Am_START_WHEN, "ANY_KEYBOARD")
                                .Set(Am_START_WHERE_TEST, true);

  Am_Object cmd = how_set_inter.Get(Am_COMMAND);
  cmd.Set(Am_DO_METHOD, change_setting);
  mywin.Add_Part(how_set_inter);

  mywin.Add_Part(DISPLAY_PART, Test_Group);

  Am_Main_Event_Loop();
  Am_Cleanup();

  return 0;
}